

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

Ptr __thiscall
r_comp::Preprocessor::process(Preprocessor *this,char *file,string *error,Metadata *metadata)

{
  byte bVar1;
  element_type *peVar2;
  int64_t iVar3;
  long lVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Metadata *in_R8;
  Ptr PVar5;
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [40];
  int64_t count;
  int64_t total;
  int64_t pass;
  uint64_t local_258;
  uint64_t b;
  uint64_t a;
  istream local_238 [8];
  ifstream stream;
  Metadata *metadata_local;
  string *error_local;
  char *file_local;
  Preprocessor *this_local;
  
  std::__cxx11::string::operator=((string *)RepliStruct::GlobalFilename_abi_cxx11_,(char *)error);
  std::ifstream::ifstream(local_238,error,8);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::operator=((string *)metadata,"unable to load file ");
    std::__cxx11::string::operator+=((string *)metadata,(char *)error);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&this->root,(nullptr_t)0x0);
  }
  else {
    peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)file);
    RepliStruct::reset(peVar2);
    peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)file);
    std::__cxx11::string::operator=((string *)&peVar2->fileName,(char *)error);
    b = 0;
    local_258 = 0;
    peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)file);
    iVar3 = RepliStruct::parse(peVar2,local_238,&b,&local_258,0);
    if (iVar3 < 0) {
      std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)file);
      RepliStruct::printError_abi_cxx11_((RepliStruct *)&pass);
      std::__cxx11::string::operator=((string *)metadata,(string *)&pass);
      std::__cxx11::string::~string((string *)&pass);
      std::ifstream::close();
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&this->root,(nullptr_t)0x0);
    }
    else {
      bVar1 = std::ios::eof();
      if ((bVar1 & 1) == 0) {
        std::__cxx11::string::operator=
                  ((string *)metadata,"Code structure error: Unexpected EOF, unmatched ) or ].\n");
        std::ifstream::close();
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&this->root,(nullptr_t)0x0);
      }
      else {
        total = 0;
        count = 0;
        while( true ) {
          peVar2 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)file);
          local_2b0._32_8_ = RepliStruct::process(peVar2);
          if ((long)local_2b0._32_8_ < 1) break;
          count = local_2b0._32_8_ + count;
          total = total + 1;
        }
        if ((long)local_2b0._32_8_ < 0) {
          std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)file);
          RepliStruct::printError_abi_cxx11_((RepliStruct *)local_2b0);
          std::__cxx11::string::operator=((string *)metadata,(string *)local_2b0);
          std::__cxx11::string::~string((string *)local_2b0);
          std::ifstream::close();
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&this->root,(nullptr_t)0x0);
        }
        else {
          if (in_R8 != (Metadata *)0x0) {
            initialize((Preprocessor *)file,in_R8);
          }
          std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)file);
          RepliStruct::printError_abi_cxx11_((RepliStruct *)local_2d0);
          std::__cxx11::string::operator=((string *)metadata,(string *)local_2d0);
          std::__cxx11::string::~string((string *)local_2d0);
          std::ifstream::close();
          lVar4 = std::__cxx11::string::size();
          if (lVar4 == 0) {
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                      (&this->root,(shared_ptr<r_comp::RepliStruct> *)file);
          }
          else {
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&this->root,(nullptr_t)0x0);
          }
        }
      }
    }
  }
  a._0_4_ = 1;
  std::ifstream::~ifstream(local_238);
  PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RepliStruct::Ptr Preprocessor::process(const char* file, std::string& error, r_comp::Metadata* metadata)
{
    RepliStruct::GlobalFilename = file;
    std::ifstream stream(file);

    if (!stream.good()) {
        error = "unable to load file ";
        error += file;
        return nullptr;
    }

    root->reset(); // trims root from previously preprocessed objects.
    root->fileName = file;
    uint64_t a = 0, b = 0;

    if (root->parse(&stream, a, b) < 0) {
        error = root->printError();
        stream.close();
        return nullptr;
    }

    if (!stream.eof()) {
        error = "Code structure error: Unexpected EOF, unmatched ) or ].\n";
        stream.close();
        return nullptr;
    }

    int64_t pass = 0, total = 0, count;

    while ((count = root->process()) > 0) {
        total += count;
        pass++;
    }

    if (count < 0) {
        error = root->printError();
        stream.close();
        return nullptr;
    }

    if (metadata) {
        initialize(metadata);
    }

    error = root->printError();
    stream.close();

    if (error.size() > 0) {
        return nullptr;
    }

    return root;
}